

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

Status __thiscall
google::protobuf::anon_unknown_21::ValidateValueFeatureSupport
          (anon_unknown_21 *this,FeatureSupport *parent,EnumValueDescriptor *value,
          string_view field_name)

{
  bool bVar1;
  Edition EVar2;
  Edition EVar3;
  EnumValueOptions *pEVar4;
  FieldOptions_FeatureSupport *from;
  char *args_4;
  string_view sVar5;
  basic_string_view<char,_std::char_traits<char>_> args_1;
  basic_string_view<char,_std::char_traits<char>_> args_1_00;
  basic_string_view<char,_std::char_traits<char>_> args_1_01;
  basic_string_view<char,_std::char_traits<char>_> args_3;
  basic_string_view<char,_std::char_traits<char>_> args_3_00;
  basic_string_view<char,_std::char_traits<char>_> args_3_01;
  undefined1 local_60 [8];
  FeatureSupport support;
  EnumValueDescriptor *value_local;
  FeatureSupport *parent_local;
  string_view field_name_local;
  Status *_status;
  
  args_4 = (char *)field_name._M_len;
  support.field_0._24_8_ = value;
  pEVar4 = EnumValueDescriptor::options(value);
  bVar1 = EnumValueOptions::has_feature_support(pEVar4);
  if (!bVar1) {
    absl::lts_20250127::OkStatus();
    return (Status)(uintptr_t)this;
  }
  FieldOptions_FeatureSupport::FieldOptions_FeatureSupport
            ((FieldOptions_FeatureSupport *)local_60,parent);
  pEVar4 = EnumValueDescriptor::options((EnumValueDescriptor *)support.field_0._24_8_);
  from = EnumValueOptions::feature_support(pEVar4);
  FieldOptions_FeatureSupport::MergeFrom((FieldOptions_FeatureSupport *)local_60,from);
  sVar5 = EnumValueDescriptor::full_name((EnumValueDescriptor *)support.field_0._24_8_);
  sVar5._M_str = (char *)sVar5._M_len;
  sVar5._M_len = (size_t)local_60;
  ValidateFeatureSupport((FeatureSupport *)this,sVar5);
  bVar1 = absl::lts_20250127::Status::ok((Status *)this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    absl::lts_20250127::Status::~Status((Status *)this);
    EVar2 = FieldOptions_FeatureSupport::edition_introduced((FieldOptions_FeatureSupport *)local_60)
    ;
    EVar3 = FieldOptions_FeatureSupport::edition_introduced(parent);
    if ((int)EVar2 < (int)EVar3) {
      sVar5 = EnumValueDescriptor::full_name((EnumValueDescriptor *)support.field_0._24_8_);
      args_1._M_str = (char *)sVar5._M_len;
      args_1._M_len = (size_t)"Feature value ";
      args_3._M_str = " was.";
      args_3._M_len = (size_t)" was introduced before feature ";
      protobuf::(anonymous_namespace)::
      Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                ((char *)this,args_1,sVar5._M_str,args_3,args_4);
    }
    else {
      bVar1 = FieldOptions_FeatureSupport::has_edition_removed(parent);
      if (bVar1) {
        EVar2 = FieldOptions_FeatureSupport::edition_removed
                          ((FieldOptions_FeatureSupport *)local_60);
        EVar3 = FieldOptions_FeatureSupport::edition_removed(parent);
        if ((int)EVar3 < (int)EVar2) {
          sVar5 = EnumValueDescriptor::full_name((EnumValueDescriptor *)support.field_0._24_8_);
          args_1_00._M_str = (char *)sVar5._M_len;
          args_1_00._M_len = (size_t)"Feature value ";
          args_3_00._M_str = " was.";
          args_3_00._M_len = (size_t)" was removed after feature ";
          protobuf::(anonymous_namespace)::
          Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                    ((char *)this,args_1_00,sVar5._M_str,args_3_00,args_4);
          goto LAB_01a26608;
        }
      }
      bVar1 = FieldOptions_FeatureSupport::has_edition_deprecated(parent);
      if (bVar1) {
        EVar2 = FieldOptions_FeatureSupport::edition_deprecated
                          ((FieldOptions_FeatureSupport *)local_60);
        EVar3 = FieldOptions_FeatureSupport::edition_deprecated(parent);
        if ((int)EVar3 < (int)EVar2) {
          sVar5 = EnumValueDescriptor::full_name((EnumValueDescriptor *)support.field_0._24_8_);
          args_1_01._M_str = (char *)sVar5._M_len;
          args_1_01._M_len = (size_t)"Feature value ";
          args_3_01._M_str = " was.";
          args_3_01._M_len = (size_t)" was deprecated after feature ";
          protobuf::(anonymous_namespace)::
          Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                    ((char *)this,args_1_01,sVar5._M_str,args_3_01,args_4);
          goto LAB_01a26608;
        }
      }
      absl::lts_20250127::OkStatus();
    }
  }
LAB_01a26608:
  FieldOptions_FeatureSupport::~FieldOptions_FeatureSupport((FieldOptions_FeatureSupport *)local_60)
  ;
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ValidateValueFeatureSupport(
    const FieldOptions::FeatureSupport& parent,
    const EnumValueDescriptor& value, absl::string_view field_name) {
  if (!value.options().has_feature_support()) {
    // We allow missing support windows on feature values, and they'll inherit
    // from the feature spec.
    return absl::OkStatus();
  }

  FieldOptions::FeatureSupport support = parent;
  support.MergeFrom(value.options().feature_support());
  RETURN_IF_ERROR(ValidateFeatureSupport(support, value.full_name()));

  // Make sure the value doesn't expand any bounds.
  if (support.edition_introduced() < parent.edition_introduced()) {
    return Error("Feature value ", value.full_name(),
                 " was introduced before feature ", field_name, " was.");
  }
  if (parent.has_edition_removed() &&
      support.edition_removed() > parent.edition_removed()) {
    return Error("Feature value ", value.full_name(),
                 " was removed after feature ", field_name, " was.");
  }
  if (parent.has_edition_deprecated() &&
      support.edition_deprecated() > parent.edition_deprecated()) {
    return Error("Feature value ", value.full_name(),
                 " was deprecated after feature ", field_name, " was.");
  }

  return absl::OkStatus();
}